

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::initialize(Player *this)

{
  Modes MVar1;
  Modes md;
  Federate *in_stack_00000030;
  Player *in_stack_00000050;
  Player *in_stack_00000060;
  Player *in_stack_00000070;
  Player *in_stack_00000080;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x17eceb);
  MVar1 = Federate::getCurrentMode((Federate *)0x17ecfa);
  if (MVar1 == STARTUP) {
    sortTags(in_stack_00000080);
    generatePublications(in_stack_00000070);
    generateEndpoints(in_stack_00000050);
    cleanUpPointList(in_stack_00000060);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17ed36);
    Federate::enterInitializingMode(in_stack_00000030);
  }
  return;
}

Assistant:

void Player::initialize()
{
    auto md = fed->getCurrentMode();
    if (md == Federate::Modes::STARTUP) {
        sortTags();
        generatePublications();
        generateEndpoints();
        cleanUpPointList();
        fed->enterInitializingMode();
    }
}